

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter.h
# Opt level: O3

uint32_t __thiscall Rel::toDot(Rel *this,stringstream *ss)

{
  element_type *peVar1;
  ostream *poVar2;
  ostream *poVar3;
  char local_50;
  undefined7 uStack_4f;
  long local_48;
  long local_40 [2];
  
  poVar3 = (ostream *)(ss + 0x10);
  local_50 = '\t';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_50,1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  local_50 = ' ';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_50,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"[shape=box, label=\"Rel\\nop: ",0x1c);
  (**((this->super_Logical).super_Expr.op.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>.
     _M_ptr)->_vptr_Token)(&local_50);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)CONCAT71(uStack_4f,local_50),local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,", fillcolor=\"#e3f2fd\", style=filled]",0x24);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((long *)CONCAT71(uStack_4f,local_50) != local_40) {
    operator_delete((long *)CONCAT71(uStack_4f,local_50),local_40[0] + 1);
  }
  local_50 = '\t';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_50,1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," -> ",4);
  peVar1 = (this->super_Logical).expr1.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar1->super_Node)._vptr_Node[1])(peVar1,ss);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  local_50 = '\t';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_50,1);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," -> ",4);
  peVar1 = (this->super_Logical).expr2.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar1->super_Node)._vptr_Node[1])(peVar1,ss);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return (uint32_t)this;
}

Assistant:

uint32_t toDot(std::stringstream& ss) override {
		uint32_t i = hash(this);

		ss << '\t' << i << ' ' << "[shape=box, label=\"Rel\\nop: " << op->toString() << "\"" << ", fillcolor=\"#e3f2fd\", style=filled]" << std::endl;

		ss << '\t' << i << " -> " << expr1->toDot(ss) << std::endl;;
		ss << '\t' << i << " -> " << expr2->toDot(ss) << std::endl;;

		return i;
	}